

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result wabt::anon_unknown_1::CheckTypes
                 (Location *loc,TypeVector *actual,TypeVector *expected,char *desc,char *index_kind,
                 Errors *errors)

{
  undefined8 uVar1;
  pointer pTVar2;
  Enum EVar3;
  size_t i;
  ulong uVar4;
  pointer pTVar5;
  Enum EVar6;
  Enum EVar7;
  ErrorLevel local_cc;
  TypeVector *local_c8;
  char *local_c0;
  Location *local_b8;
  vector<wabt::Error,std::allocator<wabt::Error>> *local_b0;
  TypeVector *local_a8;
  Type local_a0;
  Type local_98;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar2 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pTVar5 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_a8 = actual;
  if ((long)pTVar5 - (long)pTVar2 >> 3 ==
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3) {
    EVar3 = Ok;
    local_c8 = expected;
    local_c0 = desc;
    local_b8 = loc;
    local_b0 = (vector<wabt::Error,std::allocator<wabt::Error>> *)index_kind;
    for (uVar4 = 0; uVar4 < (ulong)((long)pTVar5 - (long)pTVar2 >> 3); uVar4 = uVar4 + 1) {
      local_98 = pTVar2[uVar4];
      local_a0 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar4];
      EVar7 = local_98.enum_;
      EVar6 = local_a0.enum_;
      if (EVar7 != EVar6) {
        local_cc = Error;
        Type::GetName_abi_cxx11_(&local_90,&local_98);
        uVar1 = CONCAT44(local_90._M_dataplus._M_p._4_4_,local_90._M_dataplus._M_p._0_4_);
        Type::GetName_abi_cxx11_(&local_70,&local_a0);
        StringPrintf_abi_cxx11_
                  (&local_50,"type mismatch for %s %u of %s. got %s, expected %s",local_c0,
                   uVar4 & 0xffffffff,"function",uVar1,local_70._M_dataplus._M_p);
        std::vector<wabt::Error,std::allocator<wabt::Error>>::
        emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
                  (local_b0,&local_cc,local_b8,&local_50);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        pTVar2 = (local_a8->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pTVar5 = (local_a8->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        expected = local_c8;
      }
      EVar3 = (Enum)(EVar3 != Ok || EVar7 != EVar6);
    }
  }
  else {
    local_90._M_dataplus._M_p._0_4_ = 1;
    StringPrintf_abi_cxx11_(&local_50,"expected %zd %ss, got %zd");
    std::vector<wabt::Error,std::allocator<wabt::Error>>::
    emplace_back<wabt::ErrorLevel,wabt::Location_const&,std::__cxx11::string>
              ((vector<wabt::Error,std::allocator<wabt::Error>> *)index_kind,(ErrorLevel *)&local_90
               ,loc,&local_50);
    std::__cxx11::string::_M_dispose();
    EVar3 = Error;
  }
  return (Result)EVar3;
}

Assistant:

Result CheckTypes(const Location& loc,
                  const TypeVector& actual,
                  const TypeVector& expected,
                  const char* desc,
                  const char* index_kind,
                  Errors* errors) {
  Result result = Result::Ok;
  if (actual.size() == expected.size()) {
    for (size_t i = 0; i < actual.size(); ++i) {
      result |= CheckTypeIndex(loc, actual[i], expected[i], desc, i, index_kind,
                               errors);
    }
  } else {
    errors->emplace_back(
        ErrorLevel::Error, loc,
        StringPrintf("expected %" PRIzd " %ss, got %" PRIzd, expected.size(),
                     index_kind, actual.size()));
    result = Result::Error;
  }
  return result;
}